

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaVCheckINodeDataType
              (xmlSchemaValidCtxtPtr vctxt,xmlSchemaNodeInfoPtr inode,xmlSchemaTypePtr type,
              xmlChar *value)

{
  xmlChar *value_local;
  xmlSchemaTypePtr type_local;
  xmlSchemaNodeInfoPtr inode_local;
  xmlSchemaValidCtxtPtr vctxt_local;
  
  if ((inode->flags & 0x10U) == 0) {
    vctxt_local._4_4_ =
         xmlSchemaVCheckCVCSimpleType
                   ((xmlSchemaAbstractCtxtPtr)vctxt,(xmlNodePtr)0x0,type,value,
                    (xmlSchemaValPtr *)0x0,1,0,0);
  }
  else {
    vctxt_local._4_4_ =
         xmlSchemaVCheckCVCSimpleType
                   ((xmlSchemaAbstractCtxtPtr)vctxt,(xmlNodePtr)0x0,type,value,&inode->val,1,1,0);
  }
  return vctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaVCheckINodeDataType(xmlSchemaValidCtxtPtr vctxt,
			     xmlSchemaNodeInfoPtr inode,
			     xmlSchemaTypePtr type,
			     const xmlChar *value)
{
    if (inode->flags & XML_SCHEMA_NODE_INFO_VALUE_NEEDED)
	return (xmlSchemaVCheckCVCSimpleType(
	    ACTXT_CAST vctxt, NULL,
	    type, value, &(inode->val), 1, 1, 0));
    else
	return (xmlSchemaVCheckCVCSimpleType(
	    ACTXT_CAST vctxt, NULL,
	    type, value, NULL, 1, 0, 0));
}